

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bits * __thiscall
lan::db::find_rec(db *this,string *address,db_bit_type type,db_bit_type final_type,db_bit *ref)

{
  db_bit *pdVar1;
  db_bits *pdVar2;
  string *name;
  string string;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  find__pop_address(&local_b0,(db *)address,address);
  if (address->_M_string_length == 0) {
    name = &local_50;
    std::__cxx11::string::string((string *)name,(string *)&local_b0);
    pdVar2 = find_any(this,name,final_type,ref);
LAB_00107b31:
    std::__cxx11::string::~string((string *)name);
  }
  else {
    if (local_b0._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
      pdVar1 = find_any(this,&local_90,type,ref);
      std::__cxx11::string::~string((string *)&local_90);
      if (pdVar1 != (db_bit *)0x0) {
        name = &local_70;
        std::__cxx11::string::string((string *)name,(string *)address);
        pdVar2 = find_rec(this,name,type,final_type,pdVar1->lin);
        goto LAB_00107b31;
      }
    }
    pdVar2 = (db_bits *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return pdVar2;
}

Assistant:

lan::db_bits * db::find_rec(std::string address, lan::db_bit_type const type, lan::db_bit_type const final_type, lan::db_bit * ref){
            std::string string = find__pop_address(address);
            if(address.empty()) {
                return find_any(string, final_type, ref);
            } else if(not string.empty()) {
                if((ref = find_any(string, type, ref))){
                    return find_rec(address, type, final_type, ref->lin);
                }
            } return nullptr;
        }